

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_entry_retriever.cpp
# Opt level: O1

void __thiscall
duckdb::CatalogEntryRetriever::SetSearchPath
          (CatalogEntryRetriever *this,vector<duckdb::CatalogSearchEntry,_true> *entries)

{
  pointer pCVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  ClientData *pCVar6;
  type pCVar7;
  pointer pCVar8;
  CatalogSearchEntry *entry;
  vector<duckdb::CatalogSearchEntry,_true> new_path;
  CatalogSearchEntry path;
  undefined1 local_91;
  CatalogEntryRetriever *local_90;
  vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_> local_88;
  undefined1 local_70 [32];
  _Alloc_hider local_50;
  char local_40 [16];
  
  local_88.
  super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar8 = (entries->
           super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>).
           super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (entries->
           super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>).
           super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_90 = this;
  if (pCVar8 != pCVar1) {
    do {
      bVar4 = IsInvalidCatalog((string *)pCVar8);
      if (!bVar4) {
        iVar5 = ::std::__cxx11::string::compare((char *)pCVar8);
        if (iVar5 != 0) {
          iVar5 = ::std::__cxx11::string::compare((char *)pCVar8);
          if (iVar5 != 0) {
            ::std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>::
            emplace_back<duckdb::CatalogSearchEntry>(&local_88,pCVar8);
          }
        }
      }
      pCVar8 = pCVar8 + 1;
    } while (pCVar8 != pCVar1);
  }
  if (local_88.
      super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_88.
      super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pCVar6 = ClientData::Get(local_90->context);
    pCVar7 = unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
             ::operator*(&pCVar6->catalog_search_path);
    pCVar8 = (pCVar7->set_paths).
             super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
             super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pCVar1 = (pCVar7->set_paths).
             super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
             super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pCVar8 != pCVar1) {
      do {
        pcVar2 = (pCVar8->catalog)._M_dataplus._M_p;
        local_70._0_8_ = local_70 + 0x10;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_70,pcVar2,pcVar2 + (pCVar8->catalog)._M_string_length);
        pcVar2 = (pCVar8->schema)._M_dataplus._M_p;
        local_50._M_p = local_40;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar2,pcVar2 + (pCVar8->schema)._M_string_length);
        bVar4 = IsInvalidCatalog((string *)local_70);
        if (bVar4) {
          DatabaseManager::GetDefaultDatabase_abi_cxx11_(local_90->context);
          ::std::__cxx11::string::_M_assign((string *)local_70);
        }
        ::std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>::
        emplace_back<duckdb::CatalogSearchEntry>(&local_88,(CatalogSearchEntry *)local_70);
        if (local_50._M_p != local_40) {
          operator_delete(local_50._M_p);
        }
        if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
          operator_delete((void *)local_70._0_8_);
        }
        pCVar8 = pCVar8 + 1;
      } while (pCVar8 != pCVar1);
    }
    local_70._0_8_ = (element_type *)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<duckdb::CatalogSearchPath,std::allocator<duckdb::CatalogSearchPath>,duckdb::ClientContext&,duckdb::vector<duckdb::CatalogSearchEntry,true>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8),
               (CatalogSearchPath **)local_70,(allocator<duckdb::CatalogSearchPath> *)&local_91,
               local_90->context,(vector<duckdb::CatalogSearchEntry,_true> *)&local_88);
    uVar3 = local_70._0_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_70._8_8_ + 8) = *(_Atomic_word *)(local_70._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_70._8_8_ + 8) = *(_Atomic_word *)(local_70._8_8_ + 8) + 1;
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
    }
    (local_90->search_path).internal.
    super___shared_ptr<duckdb::CatalogSearchPath,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar3;
    this_00 = (local_90->search_path).internal.
              super___shared_ptr<duckdb::CatalogSearchPath,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    (local_90->search_path).internal.
    super___shared_ptr<duckdb::CatalogSearchPath,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  ::std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>::~vector
            (&local_88);
  return;
}

Assistant:

void CatalogEntryRetriever::SetSearchPath(vector<CatalogSearchEntry> entries) {
	vector<CatalogSearchEntry> new_path;
	for (auto &entry : entries) {
		if (IsInvalidCatalog(entry.catalog) || entry.catalog == SYSTEM_CATALOG || entry.catalog == TEMP_CATALOG) {
			continue;
		}
		new_path.push_back(std::move(entry));
	}
	if (new_path.empty()) {
		return;
	}

	// push the set paths from the ClientContext behind the provided paths
	auto &client_search_path = *ClientData::Get(context).catalog_search_path;
	auto &set_paths = client_search_path.GetSetPaths();
	for (auto path : set_paths) {
		if (IsInvalidCatalog(path.catalog)) {
			path.catalog = DatabaseManager::GetDefaultDatabase(context);
		}
		new_path.push_back(std::move(path));
	}

	this->search_path = make_shared_ptr<CatalogSearchPath>(context, std::move(new_path));
}